

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristics.cpp
# Opt level: O0

void __thiscall
Clasp::DomainHeuristic::applyAction(DomainHeuristic *this,Solver *s,DomAction *a,uint16 *gPrio)

{
  bool bVar1;
  byte bVar2;
  reference pDVar3;
  unsigned_short *in_RCX;
  Solver *this_00;
  uint *in_RDX;
  key_type in_RDI;
  double dVar4;
  int16 old;
  undefined4 in_stack_ffffffffffffffb8;
  Value in_stack_ffffffffffffffbc;
  indexed_priority_queue<Clasp::ClaspVsids_t<Clasp::DomScore>::CmpScore> *in_stack_ffffffffffffffc0;
  
  std::swap<unsigned_short>(in_RCX,(unsigned_short *)((long)in_RDX + 10));
  this_00 = (Solver *)(ulong)(*in_RDX >> 0x1e);
  switch(this_00) {
  case (Solver *)0x0:
    pDVar3 = bk_lib::pod_vector<Clasp::DomScore,_std::allocator<Clasp::DomScore>_>::operator[]
                       ((pod_vector<Clasp::DomScore,_std::allocator<Clasp::DomScore>_> *)
                        (in_RDI + 8),(uint)*(undefined8 *)in_RDX & 0x3fffffff);
    std::swap<short>(&pDVar3->level,(short *)(in_RDX + 2));
    bVar1 = bk_lib::indexed_priority_queue<Clasp::ClaspVsids_t<Clasp::DomScore>::CmpScore>::
            is_in_queue((indexed_priority_queue<Clasp::ClaspVsids_t<Clasp::DomScore>::CmpScore> *)
                        this_00,in_RDI);
    if (bVar1) {
      bk_lib::indexed_priority_queue<Clasp::ClaspVsids_t<Clasp::DomScore>::CmpScore>::update
                (in_stack_ffffffffffffffc0,
                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    }
    break;
  case (Solver *)0x1:
    Solver::pref((Solver *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
    bVar2 = ValueSet::get((ValueSet *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    Solver::setPref(this_00,(Var)(in_RDI >> 0x20),(Value)in_RDI,
                    (ValueRep)((ulong)in_stack_ffffffffffffffc0 >> 0x38));
    *(ushort *)(in_RDX + 2) = (ushort)bVar2;
    break;
  case (Solver *)0x2:
    pDVar3 = bk_lib::pod_vector<Clasp::DomScore,_std::allocator<Clasp::DomScore>_>::operator[]
                       ((pod_vector<Clasp::DomScore,_std::allocator<Clasp::DomScore>_> *)
                        (in_RDI + 8),(uint)*(undefined8 *)in_RDX & 0x3fffffff);
    std::swap<short>(&pDVar3->factor,(short *)(in_RDX + 2));
    break;
  case (Solver *)0x3:
    dVar4 = (double)(int)(short)in_RDX[2];
    pDVar3 = bk_lib::pod_vector<Clasp::DomScore,_std::allocator<Clasp::DomScore>_>::operator[]
                       ((pod_vector<Clasp::DomScore,_std::allocator<Clasp::DomScore>_> *)
                        (in_RDI + 8),(uint)*(undefined8 *)in_RDX & 0x3fffffff);
    (pDVar3->super_VsidsScore).value = dVar4;
  }
  return;
}

Assistant:

void DomainHeuristic::applyAction(Solver& s, DomAction& a, uint16& gPrio) {
	std::swap(gPrio, a.prio);
	switch (a.mod) {
		default: assert(false); break;
		case DomModType::Init:
			score_[a.var].value = a.bias;
			break;
		case DomModType::Factor: std::swap(score_[a.var].factor, a.bias); break;
		case DomModType::Level:
			std::swap(score_[a.var].level, a.bias);
			if (vars_.is_in_queue(a.var)) { vars_.update(a.var); }
			break;
		case DomModType::Sign:
			int16 old = s.pref(a.var).get(ValueSet::user_value);
			s.setPref(a.var, ValueSet::user_value, ValueRep(a.bias));
			a.bias    = old;
			break;
	}
}